

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::priceByRowDenseResult
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,HVector *column,
          HighsInt from_index,HighsInt debug_report)

{
  double multiplier;
  int iVar1;
  int to_iEl;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  pointer piVar6;
  
  for (lVar8 = (long)from_index; lVar8 < column->count; lVar8 = lVar8 + 1) {
    iVar1 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    multiplier = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1];
    piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = piVar6 + (long)iVar1 + 1;
    if (this->format_ == kRowwisePartitioned) {
      piVar7 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1;
    }
    to_iEl = *piVar7;
    if (debug_report == -1 || iVar1 == debug_report) {
      debugReportRowPrice(this,iVar1,multiplier,to_iEl,result);
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = (long)piVar6[iVar1]; lVar5 < to_iEl; lVar5 = lVar5 + 1) {
      iVar1 = piVar2[lVar5];
      dVar10 = pdVar3[lVar5] * multiplier + pdVar4[iVar1];
      uVar9 = -(ulong)(ABS(dVar10) < 1e-14);
      pdVar4[iVar1] = (double)(uVar9 & 0x358dee7a4ad4b81f | ~uVar9 & (ulong)dVar10);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowDenseResult(
    std::vector<double>& result, const HVector& column,
    const HighsInt from_index, const HighsInt debug_report) const {
  // Assumes that result is zeroed beforehand - in case continuing
  // priceByRow after switch from sparse
  assert(this->isRowwise());
  for (HighsInt ix = from_index; ix < column.count; ix++) {
    HighsInt iRow = column.index[ix];
    double multiplier = column.array[iRow];
    // Determine whether p_end_ or the next start_ should be used to end the
    // loop
    HighsInt to_iEl;
    if (this->format_ == MatrixFormat::kRowwisePartitioned) {
      to_iEl = this->p_end_[iRow];
    } else {
      to_iEl = this->start_[iRow + 1];
    }
    if (debug_report == kDebugReportAll || debug_report == iRow)
      debugReportRowPrice(iRow, multiplier, to_iEl, result);
    for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
      HighsInt iCol = this->index_[iEl];
      double value0 = result[iCol];
      double value1 = value0 + multiplier * this->value_[iEl];
      result[iCol] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
}